

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_doFollowPlayer(void)

{
  double *pdVar1;
  double dVar2;
  AActor *pAVar3;
  double dVar4;
  double sy;
  double sx;
  double local_38;
  double local_30;
  DAngle local_28;
  
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
  dVar2 = _ZL8f_oldloc_0;
  if (pAVar3 != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    dVar4 = _ZL8f_oldloc_1;
    if ((dVar2 == (pAVar3->__Pos).X) && (!NAN(dVar2) && !NAN((pAVar3->__Pos).X))) {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
      pdVar1 = &(pAVar3->__Pos).Y;
      if ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1))) {
        return;
      }
    }
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    m_x = (pAVar3->__Pos).X - m_w * 0.5;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    m_y = (pAVar3->__Pos).Y - m_h * 0.5;
    m_x2 = m_x + m_w;
    m_y2 = m_y + m_h;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    dVar2 = _ZL8f_oldloc_1;
    dVar4 = (pAVar3->__Pos).X - _ZL8f_oldloc_0;
    local_30 = dVar4;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    local_38 = dVar2 - (pAVar3->__Pos).Y;
    if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
      local_28.Degrees = (pAVar3->Angles).Yaw.Degrees + -90.0;
      AM_rotate(&local_30,&local_38,&local_28);
      dVar4 = local_30;
    }
    AM_ScrollParchment(dVar4,local_38);
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    _ZL8f_oldloc_0 = (pAVar3->__Pos).X;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    _ZL8f_oldloc_1 = (pAVar3->__Pos).Y;
  }
  return;
}

Assistant:

void AM_doFollowPlayer ()
{
	double sx, sy;

    if (players[consoleplayer].camera != NULL &&
		(f_oldloc.x != players[consoleplayer].camera->X() ||
		 f_oldloc.y != players[consoleplayer].camera->Y()))
	{
		m_x = players[consoleplayer].camera->X() - m_w/2;
		m_y = players[consoleplayer].camera->Y() - m_h/2;
		m_x2 = m_x + m_w;
		m_y2 = m_y + m_h;

  		// do the parallax parchment scrolling.
		sx = (players[consoleplayer].camera->X() - f_oldloc.x);
		sy = (f_oldloc.y - players[consoleplayer].camera->Y());
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotate (&sx, &sy, players[consoleplayer].camera->Angles.Yaw - 90);
		}
		AM_ScrollParchment (sx, sy);

		f_oldloc.x = players[consoleplayer].camera->X();
		f_oldloc.y = players[consoleplayer].camera->Y();
	}
}